

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median-sorted.cpp
# Opt level: O2

double findMedianSortedArrays
                 (vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar12 = (ulong)((long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  iVar11 = (int)uVar12;
  iVar1 = (int)((ulong)((long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  iVar4 = (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) / 2) + iVar1 +
          -1;
  iVar6 = 0;
  if (iVar4 < 1) {
    iVar4 = iVar6;
  }
  iVar7 = 0;
  while( true ) {
    lVar10 = (long)iVar7;
    bVar13 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar13) break;
    iVar8 = piVar2[iVar6];
    iVar9 = piVar3[lVar10];
    if (iVar8 < iVar9) {
      if (iVar6 < iVar1 + -1) {
        iVar8 = piVar2[(long)iVar6 + 1];
        iVar6 = iVar6 + 1;
      }
      else {
        iVar7 = iVar7 + 1;
        iVar9 = piVar3[lVar10 + 1];
      }
    }
    if (iVar9 <= iVar8) {
      if (iVar7 < iVar11 + -1) {
        iVar7 = iVar7 + 1;
      }
      else {
        iVar6 = iVar6 + 1;
      }
    }
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar2[(long)iVar6 + -1]);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar10 + -1]);
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar4 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[(long)iVar6 + -1];
  if ((iVar11 + iVar1 & 0x80000001U) == 1) {
    iVar1 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar10 + -1];
    if (iVar4 < iVar1) {
      dVar14 = (double)iVar4;
    }
    else {
      dVar14 = (double)iVar1;
    }
  }
  else {
    dVar14 = ((double)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar10 + -1] + (double)iVar4) * 0.5;
  }
  return dVar14;
}

Assistant:

double findMedianSortedArrays(const vector<int> &A, const vector<int> &B) {

  int lA = A.size();
  int lB = B.size();
  int medPos = (lA + lB / 2) - 1;
  int a = 0, b = 0 , c = 0;
  while (c < medPos) {
    if (A[a] < B[b]) {
      if (a < lA - 1) a++;
      else b++;
    }
    if (A[a] >= B[b]) {
      if (b < lB - 1) b++;
      else a++;
    }
    c++;
  }
  cout<<A[a-1]<<' '<<B[b-1]<<endl;

  if ((lA + lB) % 2 == 1) {
    if (A[a-1] < B[b-1]) return A[a-1];
    else return B[b-1];
  } else {
    return (((double)A[a-1]) + ((double)B[b-1])) / 2;
  }
}